

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::RenderBuffer::RenderBuffer
          (RenderBuffer *this,RenderBufferType type_,uint sizeX_,uint sizeY_)

{
  runtime_error *this_00;
  
  this->_vptr_RenderBuffer = (_func_int **)&PTR__RenderBuffer_004b6828;
  this->type = type_;
  this->sizeX = sizeX_;
  this->sizeY = sizeY_;
  if ((sizeX_ < 0x400001) && (sizeY_ < 0x400001)) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"OpenGL error: invalid renderbuffer dimensions");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

RenderBuffer::RenderBuffer(RenderBufferType type_, unsigned int sizeX_, unsigned int sizeY_)
    : type(type_), sizeX(sizeX_), sizeY(sizeY_) {
  if (sizeX > (1 << 22) || sizeY > (1 << 22)) throw std::runtime_error("OpenGL error: invalid renderbuffer dimensions");
}